

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseStart
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  pointer ppTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer ppTVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  String SVar7;
  String counts;
  void *local_28 [2];
  
  String::operator=(&this->test_case_name_,(test_case->name_).c_str_);
  ppTVar3 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar1 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar3 == ppTVar1) {
    pcVar4 = "tests";
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar5 = (int)uVar6 + (uint)(*ppTVar3)->should_run_;
      uVar6 = (ulong)uVar5;
      ppTVar3 = ppTVar3 + 1;
    } while (ppTVar3 != ppTVar1);
    pcVar4 = "tests";
    if (uVar5 == 1) {
      pcVar4 = "test";
    }
  }
  SVar7 = String::Format((char *)local_28,"%d %s",uVar6,pcVar4);
  ColoredPrintf(COLOR_GREEN,"[----------] ",SVar7.length_);
  printf("%s from %s",local_28[0],(this->test_case_name_).c_str_);
  pbVar2 = (test_case->type_param_).ptr_;
  if ((pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     ((pbVar2->_M_dataplus)._M_p == (pointer)0x0)) {
    putchar(10);
  }
  else {
    printf(", where TypeParam = %s\n");
  }
  fflush(_stdout);
  if (local_28[0] == (void *)0x0) {
    return;
  }
  operator_delete__(local_28[0]);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseStart(const TestCase& test_case) {
  test_case_name_ = test_case.name();
  const internal::String counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s", counts.c_str(), test_case_name_.c_str());
  if (test_case.type_param() == NULL) {
    printf("\n");
  } else {
    printf(", where TypeParam = %s\n", test_case.type_param());
  }
  fflush(stdout);
}